

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_verify_vector.cpp
# Opt level: O3

OperatorResultType __thiscall
duckdb::PhysicalVerifyVector::Execute
          (PhysicalVerifyVector *this,ExecutionContext *context,DataChunk *input,DataChunk *chunk,
          GlobalOperatorState *gstate,OperatorState *state)

{
  OperatorResultType OVar1;
  InternalException *this_00;
  string local_40;
  
  switch(this->verification) {
  case DICTIONARY_OPERATOR:
    VerifyEmitDictionaryVectors(input,chunk,(OperatorState *)input);
    break;
  case CONSTANT_OPERATOR:
    OVar1 = VerifyEmitConstantVectors(input,chunk,state);
    return OVar1;
  case SEQUENCE_OPERATOR:
    OVar1 = VerifyEmitSequenceVector(input,chunk,state);
    return OVar1;
  case NESTED_SHUFFLE:
    VerifyEmitNestedShuffleVector(input,chunk,(OperatorState *)input);
    break;
  default:
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"PhysicalVerifyVector created but no verification code present",
               "");
    InternalException::InternalException(this_00,&local_40);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  return NEED_MORE_INPUT;
}

Assistant:

OperatorResultType PhysicalVerifyVector::Execute(ExecutionContext &context, DataChunk &input, DataChunk &chunk,
                                                 GlobalOperatorState &gstate, OperatorState &state) const {
	switch (verification) {
	case DebugVectorVerification::DICTIONARY_OPERATOR:
		return VerifyEmitDictionaryVectors(input, chunk, state);
	case DebugVectorVerification::CONSTANT_OPERATOR:
		return VerifyEmitConstantVectors(input, chunk, state);
	case DebugVectorVerification::SEQUENCE_OPERATOR:
		return VerifyEmitSequenceVector(input, chunk, state);
	case DebugVectorVerification::NESTED_SHUFFLE:
		return VerifyEmitNestedShuffleVector(input, chunk, state);
	default:
		throw InternalException("PhysicalVerifyVector created but no verification code present");
	}
}